

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall RtMidiIn::openMidiApi(RtMidiIn *this,Api api,string *clientName,uint queueSizeLimit)

{
  MidiApi *pMVar1;
  
  pMVar1 = (this->super_RtMidi).rtapi_;
  if (pMVar1 != (MidiApi *)0x0) {
    (*pMVar1->_vptr_MidiApi[1])();
  }
  (this->super_RtMidi).rtapi_ = (MidiApi *)0x0;
  if (api == LINUX_ALSA) {
    pMVar1 = (MidiApi *)operator_new(0xb8);
    MidiInAlsa::MidiInAlsa((MidiInAlsa *)pMVar1,clientName,queueSizeLimit);
    (this->super_RtMidi).rtapi_ = pMVar1;
  }
  return;
}

Assistant:

void RtMidiIn :: openMidiApi( RtMidi::Api api, const std::string &clientName, unsigned int queueSizeLimit )
{
  delete rtapi_;
  rtapi_ = 0;

#if defined(__UNIX_JACK__)
  if ( api == UNIX_JACK )
    rtapi_ = new MidiInJack( clientName, queueSizeLimit );
#endif
#if defined(__LINUX_ALSA__)
  if ( api == LINUX_ALSA )
    rtapi_ = new MidiInAlsa( clientName, queueSizeLimit );
#endif
#if defined(__WINDOWS_MM__)
  if ( api == WINDOWS_MM )
    rtapi_ = new MidiInWinMM( clientName, queueSizeLimit );
#endif
#if defined(__MACOSX_CORE__)
  if ( api == MACOSX_CORE )
    rtapi_ = new MidiInCore( clientName, queueSizeLimit );
#endif
#if defined(__RTMIDI_DUMMY__)
  if ( api == RTMIDI_DUMMY )
    rtapi_ = new MidiInDummy( clientName, queueSizeLimit );
#endif
}